

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_device_start__jack(ma_device *pDevice)

{
  int iVar1;
  ma_device_type mVar2;
  ma_log_proc p_Var3;
  long *plVar4;
  undefined8 uVar5;
  char *pcVar6;
  ma_result mVar7;
  ma_context *pmVar8;
  long lVar9;
  char *pServerPort;
  long lVar10;
  
  pmVar8 = pDevice->pContext;
  iVar1 = (*(pmVar8->field_21).alsa.snd_pcm_hw_params_set_rate_near)
                    ((pDevice->field_23).alsa.pPCMPlayback);
  if (iVar1 != 0) {
    pmVar8 = pDevice->pContext;
    mVar7 = -0x12e;
    if (pmVar8 == (ma_context *)0x0) {
      return -0x12e;
    }
    p_Var3 = pmVar8->logCallback;
    if (p_Var3 == (ma_log_proc)0x0) {
      return -0x12e;
    }
    pcVar6 = "[JACK] Failed to activate the JACK client.";
    goto LAB_0010fb86;
  }
  mVar2 = pDevice->type;
  if ((mVar2 & ~ma_device_type_playback) == ma_device_type_capture) {
    plVar4 = (long *)(*(pmVar8->field_21).alsa.snd_pcm_hw_params_set_rate_resample)
                               ((pDevice->field_23).alsa.pPCMPlayback,0,"32 bit float mono audio",6)
    ;
    if (plVar4 != (long *)0x0) {
      lVar10 = *plVar4;
      if (lVar10 != 0) {
        lVar9 = 0x5478;
        do {
          uVar5 = (*(pmVar8->field_21).alsa.snd_pcm_hw_params_get_format)
                            (*(undefined8 *)((long)&pDevice->pContext + lVar9));
          iVar1 = (*(pmVar8->field_21).alsa.snd_pcm_hw_params_set_periods_near)
                            ((pDevice->field_23).alsa.pPCMPlayback,lVar10,uVar5);
          if (iVar1 != 0) goto LAB_0010fcd2;
          lVar10 = *(long *)((long)plVar4 + lVar9 + -0x5470);
          lVar9 = lVar9 + 8;
        } while (lVar10 != 0);
      }
      (*(pmVar8->field_21).alsa.snd_pcm_hw_params_get_channels_min)(plVar4);
      mVar2 = pDevice->type;
      goto LAB_0010fc21;
    }
  }
  else {
LAB_0010fc21:
    if ((mVar2 | ma_device_type_capture) != ma_device_type_duplex) {
      return 0;
    }
    plVar4 = (long *)(*(pmVar8->field_21).alsa.snd_pcm_hw_params_set_rate_resample)
                               ((pDevice->field_23).alsa.pPCMPlayback,0,"32 bit float mono audio",5)
    ;
    if (plVar4 != (long *)0x0) {
      lVar10 = *plVar4;
      if (lVar10 != 0) {
        lVar9 = 0x5378;
        do {
          uVar5 = (*(pmVar8->field_21).alsa.snd_pcm_hw_params_get_format)
                            (*(undefined8 *)((long)&pDevice->pContext + lVar9));
          iVar1 = (*(pmVar8->field_21).alsa.snd_pcm_hw_params_set_periods_near)
                            ((pDevice->field_23).alsa.pPCMPlayback,uVar5,lVar10);
          if (iVar1 != 0) goto LAB_0010fcd2;
          lVar10 = *(long *)((long)plVar4 + lVar9 + -0x5370);
          lVar9 = lVar9 + 8;
        } while (lVar10 != 0);
      }
      (*(pmVar8->field_21).alsa.snd_pcm_hw_params_get_channels_min)(plVar4);
      return 0;
    }
  }
  (*(pmVar8->field_21).alsa.snd_pcm_hw_params_set_buffer_size_near)
            ((pDevice->field_23).alsa.pPCMPlayback);
  pmVar8 = pDevice->pContext;
  mVar7 = -1;
  if (pmVar8 == (ma_context *)0x0) {
    return -1;
  }
  p_Var3 = pmVar8->logCallback;
  if (p_Var3 == (ma_log_proc)0x0) {
    return -1;
  }
  pcVar6 = "[JACK] Failed to retrieve physical ports.";
LAB_0010fb86:
  (*p_Var3)(pmVar8,pDevice,1,pcVar6);
  return mVar7;
LAB_0010fcd2:
  (*(pmVar8->field_21).alsa.snd_pcm_hw_params_get_channels_min)(plVar4);
  (*(pmVar8->field_21).alsa.snd_pcm_hw_params_set_buffer_size_near)
            ((pDevice->field_23).alsa.pPCMPlayback);
  pmVar8 = pDevice->pContext;
  mVar7 = -1;
  if (pmVar8 == (ma_context *)0x0) {
    return -1;
  }
  p_Var3 = pmVar8->logCallback;
  if (p_Var3 == (ma_log_proc)0x0) {
    return -1;
  }
  pcVar6 = "[JACK] Failed to connect ports.";
  goto LAB_0010fb86;
}

Assistant:

static ma_result ma_device_start__jack(ma_device* pDevice)
{
    ma_context* pContext = pDevice->pContext;
    int resultJACK;
    size_t i;

    resultJACK = ((ma_jack_activate_proc)pContext->jack.jack_activate)((ma_jack_client_t*)pDevice->jack.pClient);
    if (resultJACK != 0) {
        return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[JACK] Failed to activate the JACK client.", MA_FAILED_TO_START_BACKEND_DEVICE);
    }

    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        const char** ppServerPorts = ((ma_jack_get_ports_proc)pContext->jack.jack_get_ports)((ma_jack_client_t*)pDevice->jack.pClient, NULL, MA_JACK_DEFAULT_AUDIO_TYPE, ma_JackPortIsPhysical | ma_JackPortIsOutput);
        if (ppServerPorts == NULL) {
            ((ma_jack_deactivate_proc)pContext->jack.jack_deactivate)((ma_jack_client_t*)pDevice->jack.pClient);
            return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[JACK] Failed to retrieve physical ports.", MA_ERROR);
        }

        for (i = 0; ppServerPorts[i] != NULL; ++i) {
            const char* pServerPort = ppServerPorts[i];
            const char* pClientPort = ((ma_jack_port_name_proc)pContext->jack.jack_port_name)((ma_jack_port_t*)pDevice->jack.pPortsCapture[i]);

            resultJACK = ((ma_jack_connect_proc)pContext->jack.jack_connect)((ma_jack_client_t*)pDevice->jack.pClient, pServerPort, pClientPort);
            if (resultJACK != 0) {
                ((ma_jack_free_proc)pContext->jack.jack_free)((void*)ppServerPorts);
                ((ma_jack_deactivate_proc)pContext->jack.jack_deactivate)((ma_jack_client_t*)pDevice->jack.pClient);
                return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[JACK] Failed to connect ports.", MA_ERROR);
            }
        }

        ((ma_jack_free_proc)pContext->jack.jack_free)((void*)ppServerPorts);
    }
    
    if (pDevice->type == ma_device_type_playback || pDevice->type == ma_device_type_duplex) {
        const char** ppServerPorts = ((ma_jack_get_ports_proc)pContext->jack.jack_get_ports)((ma_jack_client_t*)pDevice->jack.pClient, NULL, MA_JACK_DEFAULT_AUDIO_TYPE, ma_JackPortIsPhysical | ma_JackPortIsInput);
        if (ppServerPorts == NULL) {
            ((ma_jack_deactivate_proc)pContext->jack.jack_deactivate)((ma_jack_client_t*)pDevice->jack.pClient);
            return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[JACK] Failed to retrieve physical ports.", MA_ERROR);
        }

        for (i = 0; ppServerPorts[i] != NULL; ++i) {
            const char* pServerPort = ppServerPorts[i];
            const char* pClientPort = ((ma_jack_port_name_proc)pContext->jack.jack_port_name)((ma_jack_port_t*)pDevice->jack.pPortsPlayback[i]);

            resultJACK = ((ma_jack_connect_proc)pContext->jack.jack_connect)((ma_jack_client_t*)pDevice->jack.pClient, pClientPort, pServerPort);
            if (resultJACK != 0) {
                ((ma_jack_free_proc)pContext->jack.jack_free)((void*)ppServerPorts);
                ((ma_jack_deactivate_proc)pContext->jack.jack_deactivate)((ma_jack_client_t*)pDevice->jack.pClient);
                return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[JACK] Failed to connect ports.", MA_ERROR);
            }
        }

        ((ma_jack_free_proc)pContext->jack.jack_free)((void*)ppServerPorts);
    }

    return MA_SUCCESS;
}